

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseTitle(TidyDocImpl *doc,Node *title,GetTokenMode mode)

{
  Bool BVar1;
  Node *node_00;
  Node *node;
  GetTokenMode mode_local;
  Node *title_local;
  TidyDocImpl *doc_local;
  
  while( true ) {
    while( true ) {
      node_00 = prvTidyGetToken(doc,MixedContent);
      if (node_00 == (Node *)0x0) {
        prvTidyReport(doc,title,(Node *)0x0,0x25a);
        return;
      }
      if (((node_00->tag != title->tag) || (node_00->type != StartTag)) ||
         ((int)(doc->config).value[9].v == 0)) break;
      prvTidyReport(doc,title,node_00,0x232);
      node_00->type = EndTag;
      prvTidyUngetToken(doc);
    }
    if ((node_00->tag == title->tag) && (node_00->type == EndTag)) break;
    BVar1 = prvTidynodeIsText(node_00);
    if (BVar1 == no) {
      BVar1 = InsertMisc(title,node_00);
      if (BVar1 == no) {
        if (node_00->tag != (Dict *)0x0) {
          prvTidyReport(doc,title,node_00,0x259);
          prvTidyUngetToken(doc);
          TrimSpaces(doc,title);
          return;
        }
        prvTidyReport(doc,title,node_00,0x235);
        prvTidyFreeNode(doc,node_00);
      }
    }
    else {
      if (title->content == (Node *)0x0) {
        TrimInitialSpace(doc,title,node_00);
      }
      if (node_00->start < node_00->end) {
        prvTidyInsertNodeAtEnd(title,node_00);
      }
      else {
        prvTidyFreeNode(doc,node_00);
      }
    }
  }
  prvTidyFreeNode(doc,node_00);
  title->closed = yes;
  TrimSpaces(doc,title);
  return;
}

Assistant:

void TY_(ParseTitle)(TidyDocImpl* doc, Node *title, GetTokenMode ARG_UNUSED(mode))
{
    Node *node;
    while ((node = TY_(GetToken)(doc, MixedContent)) != NULL)
    {
        if (node->tag == title->tag && node->type == StartTag
            && cfgBool(doc, TidyCoerceEndTags) )
        {
            TY_(Report)(doc, title, node, COERCE_TO_ENDTAG);
            node->type = EndTag;
            TY_(UngetToken)( doc );
            continue;
        }
        else if (node->tag == title->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            title->closed = yes;
            TrimSpaces(doc, title);
            return;
        }

        if (TY_(nodeIsText)(node))
        {
            /* only called for 1st child */
            if (title->content == NULL)
                TrimInitialSpace(doc, title, node);

            if (node->start >= node->end)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            TY_(InsertNodeAtEnd)(title, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(title, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, title, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* pushback unexpected tokens */
        TY_(Report)(doc, title, node, MISSING_ENDTAG_BEFORE);
        TY_(UngetToken)( doc );
        TrimSpaces(doc, title);
        return;
    }

    TY_(Report)(doc, title, node, MISSING_ENDTAG_FOR);
}